

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O1

color_theme * color_theme_create(void)

{
  color_theme *pcVar1;
  
  pcVar1 = (color_theme *)malloc(0x20);
  if (pcVar1 != (color_theme *)0x0) {
    pcVar1->unfocused = (color_value *)0x0;
    pcVar1->focused = (color_value *)0x0;
    pcVar1->urgent = (color_value *)0x0;
    pcVar1->sticky = (color_value *)0x0;
    return pcVar1;
  }
  return (color_theme *)0x0;
}

Assistant:

struct color_theme *color_theme_create(void)
{
        struct color_theme *theme = malloc(sizeof(struct color_theme));

        if (theme == NULL) {
                return NULL;
        }

        theme->unfocused = NULL;
        theme->focused = NULL;
        theme->urgent = NULL;
        theme->sticky = NULL;

        return theme;
}